

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_renderer.cpp
# Opt level: O0

void __thiscall dpfb::FontRendererCreator::FontRendererCreator(FontRendererCreator *this,char *name)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  FontRendererCreator *pFVar3;
  char *__s2;
  bool bVar4;
  long *local_20;
  FontRendererCreator **pos;
  char *name_local;
  FontRendererCreator *this_local;
  
  this->_vptr_FontRendererCreator = (_func_int **)&PTR__FontRendererCreator_001667d0;
  this->name = name;
  pcVar2 = getName(this);
  pFVar3 = find(pcVar2);
  __stream = _stderr;
  if (pFVar3 != (FontRendererCreator *)0x0) {
    pcVar2 = getName(this);
    fprintf(__stream,"FontRendererCreator \"%s\" is already registered\n",pcVar2);
    exit(1);
  }
  local_20 = &list;
  while( true ) {
    bVar4 = false;
    if (*local_20 != 0) {
      pcVar2 = *(char **)(*local_20 + 8);
      __s2 = getName(this);
      iVar1 = strcmp(pcVar2,__s2);
      bVar4 = iVar1 < 0;
    }
    if (!bVar4) break;
    local_20 = (long *)(*local_20 + 0x10);
  }
  this->next = (FontRendererCreator *)*local_20;
  *local_20 = (long)this;
  return;
}

Assistant:

FontRendererCreator::FontRendererCreator(const char* name)
    : name {name}
{
    LINK_PLUGIN(FontRendererCreator);
}